

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

void CLOSE_BRACKET_WITHOUT_ESC_WARN(ParseEnv *env,OnigUChar *c)

{
  OnigUChar local_118 [8];
  OnigUChar buf [256];
  OnigUChar *c_local;
  ParseEnv *env_local;
  
  if ((onig_warn != onig_null_warn) && ((env->syntax->behavior & 0x1000000) != 0)) {
    buf._248_8_ = c;
    onig_snprintf_with_pattern
              (local_118,0x100,env->enc,env->pattern,env->pattern_end,
               "regular expression has \'%s\' without escape",c);
    (*onig_warn)((char *)local_118);
  }
  return;
}

Assistant:

static void
CLOSE_BRACKET_WITHOUT_ESC_WARN(ParseEnv* env, UChar* c)
{
  if (onig_warn == onig_null_warn) return ;

  if (IS_SYNTAX_BV((env)->syntax, ONIG_SYN_WARN_CC_OP_NOT_ESCAPED)) {
    UChar buf[WARN_BUFSIZE];
    onig_snprintf_with_pattern(buf, WARN_BUFSIZE, (env)->enc,
                         (env)->pattern, (env)->pattern_end,
                         "regular expression has '%s' without escape", c);
    (*onig_warn)((char* )buf);
  }
}